

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

factor * __thiscall
merlin::factor::marginal(factor *__return_storage_ptr__,factor *this,variable_set *target)

{
  pointer pdVar1;
  pointer pdVar2;
  size_t i;
  ulong uVar3;
  subindex s;
  subindex local_60;
  
  variable_set::operator&((variable_set *)&local_60,target,&this->v_);
  factor(__return_storage_ptr__,(variable_set *)&local_60,0.0);
  variable_set::~variable_set((variable_set *)&local_60);
  subindex::subindex(&local_60,&this->v_,&__return_storage_ptr__->v_);
  for (uVar3 = 0;
      pdVar1 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar3 = uVar3 + 1) {
    pdVar2 = (__return_storage_ptr__->t_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar2[local_60.m_idx] = pdVar1[uVar3] + pdVar2[local_60.m_idx];
    subindex::operator++(&local_60);
  }
  subindex::~subindex(&local_60);
  return __return_storage_ptr__;
}

Assistant:

factor marginal(variable_set const& target) const {
		factor F(target & vars(), 0.0);
		subindex s(v_, F.vars());
		for (size_t i = 0; i < num_states(); ++i, ++s)
			F[s] += t_[i];
		return F;
	}